

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTryTable(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Id IVar1;
  Tag *pTVar2;
  Expression *target;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  byte bVar3;
  bool __x;
  uint32_t uVar4;
  uint32_t uVar5;
  Expression *body;
  value_type *pvVar6;
  size_t sVar7;
  value_type *ppEVar8;
  TryTable *pTVar9;
  TranslateToFuzzReader *this_01;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  Type TVar13;
  Iterator __first;
  Iterator __last;
  _Storage<wasm::Type,_true> local_120;
  uint7 uStack_117;
  _Storage<wasm::Type,_true> local_110;
  uint7 uStack_107;
  Type local_100;
  Type tagTypeWithExn;
  undefined1 auStack_e8 [8];
  Name tagName;
  undefined1 local_d0 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> vec;
  Name dest;
  Type local_a0;
  undefined1 auStack_98 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchDests;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  undefined1 auStack_58 [8];
  vector<bool,_std::allocator<bool>_> catchRefs;
  
  body = make(this,type);
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    auStack_78 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_98 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_117 << 8;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_120;
    pTVar9 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98,
                        (vector<bool,_std::allocator<bool>_> *)auStack_58,type_01);
  }
  else {
    if (*(long *)(this->wasm + 0x48) == *(long *)(this->wasm + 0x50)) {
      addTag(this);
    }
    auStack_78 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar12 = 0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_98 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    this_00 = &this->random;
    uVar4 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
    do {
      auStack_e8 = (undefined1  [8])0x0;
      tagName.super_IString.str._M_len = 0;
      local_a0.id = 0;
      if ((uint)uVar12 < uVar4) {
        pvVar6 = Random::
                 pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                           (this_00,(vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                     *)(this->wasm + 0x48));
        pTVar2 = (pvVar6->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                 super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
        auStack_e8 = *(undefined1 (*) [8])&(pTVar2->super_Importable).super_Named;
        tagName.super_IString.str._M_len =
             *(size_t *)((long)&(pTVar2->super_Importable).super_Named + 8);
        local_a0.id = wasm::HeapType::getSignature();
      }
      else {
        if ((auStack_78 !=
             (undefined1  [8])
             catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start) && (uVar5 = Random::upTo(this_00,2), uVar5 == 0))
        break;
        local_a0.id = 0;
      }
      sVar7 = Type::size(&local_a0);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_a0
      ;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar7;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_a0;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_d0,__first,__last,
                 (allocator_type *)
                 &vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x48;
      if (vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_d0,
                   (iterator)
                   vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (Type *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      }
      else {
        (vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = 0x48;
        vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      tagTypeWithExn.id = uVar12;
      wasm::Type::Type(&local_100,local_d0);
      iVar10 = (this->fuzzParams->super_FuzzParams).TRIES;
      if (0 < iVar10) {
        while( true ) {
          this_01 = (TranslateToFuzzReader *)this_00;
          ppEVar8 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this_00,&this->funcContext->breakableStack);
          target = *ppEVar8;
          join_0x00000010_0x00000000_ = (string_view)getTargetName(this_01,target);
          IVar1 = target->_id;
          if (IVar1 != BlockId) {
            TVar13.id = 0;
          }
          else {
            TVar13.id = (target->type).id;
          }
          if (IVar1 != BlockId && IVar1 != LoopId) {
            wasm::handle_unreachable
                      ("unexpected expr type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0x15f4);
          }
          bVar3 = wasm::Type::isSubType(local_a0,TVar13);
          __x = (bool)wasm::Type::isSubType(local_100,TVar13);
          if ((bVar3 | __x) == 1) break;
          if (iVar10 < 2) goto LAB_0012f3dd;
          iVar10 = iVar10 + -1;
        }
        if (catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_78,
                     (iterator)
                     catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)auStack_e8);
        }
        else {
          ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len = (size_t)auStack_e8;
          ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str =
               (char *)tagName.super_IString.str._M_len;
          catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        if (catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_98,
                     (iterator)
                     catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (Name *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          ((catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               (size_t)vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          ((catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str =
               (char *)dest.super_IString.str._M_len;
          catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)auStack_58,__x);
      }
LAB_0012f3dd:
      if (local_d0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_d0,
                        (long)vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_d0);
      }
      uVar11 = (int)tagTypeWithExn.id + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 <= uVar4);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_107 << 8;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_110;
    pTVar9 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_98,
                        (vector<bool,_std::allocator<bool>_> *)auStack_58,type_00);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                    (long)auStack_58);
    auStack_58 = (undefined1  [8])0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffff00000000);
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p &
         0xffffffff00000000);
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
  }
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    (long)catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_98);
  }
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,
                    (long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
  }
  return (Expression *)pTVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeTryTable(Type type) {
  auto* body = make(type);

  if (funcContext->breakableStack.empty()) {
    // Nothing to break to, emit a trivial TryTable.
    // TODO: Perhaps generate a block wrapping us?
    return builder.makeTryTable(body, {}, {}, {});
  }

  if (wasm.tags.empty()) {
    addTag();
  }

  // Add catches of specific tags, and possibly a catch_all at the end. We use
  // the last iteration of the loop for that.
  std::vector<Name> catchTags;
  std::vector<Name> catchDests;
  std::vector<bool> catchRefs;
  auto numCatches = upTo(fuzzParams->MAX_TRY_CATCHES);
  for (Index i = 0; i <= numCatches; i++) {
    Name tagName;
    Type tagType;
    if (i < numCatches) {
      // Look for a specific tag.
      auto& tag = pick(wasm.tags);
      tagName = tag->name;
      tagType = tag->params();
    } else {
      // Add a catch_all at the end, some of the time (but all of the time if we
      // have nothing else).
      if (!catchTags.empty() && oneIn(2)) {
        break;
      }
      tagType = Type::none;
    }

    // We need to find a proper target to break to, which means a target that
    // has the type of the tag, or the tag + an exnref at the end.
    std::vector<Type> vec(tagType.begin(), tagType.end());
    // Use a non-nullable exnref here, and then the subtyping check below will
    // also accept a target that is nullable.
    vec.push_back(Type(HeapType::exn, NonNullable));
    auto tagTypeWithExn = Type(vec);
    int tries = fuzzParams->TRIES;
    while (tries-- > 0) {
      auto* target = pick(funcContext->breakableStack);
      auto dest = getTargetName(target);
      auto valueType = getTargetType(target);
      auto subOfTagType = Type::isSubType(tagType, valueType);
      auto subOfTagTypeWithExn = Type::isSubType(tagTypeWithExn, valueType);
      if (subOfTagType || subOfTagTypeWithExn) {
        catchTags.push_back(tagName);
        catchDests.push_back(dest);
        catchRefs.push_back(subOfTagTypeWithExn);
        break;
      }
    }
    // TODO: Perhaps generate a block wrapping us, if we fail to find a target?
    // TODO: It takes a bit of luck to find a target with an exnref - perhaps
    //       generate those?
  }

  return builder.makeTryTable(body, catchTags, catchDests, catchRefs);
}